

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void * randomx::AlignedAllocator<64UL>::allocMemory(size_t count)

{
  int iVar1;
  void *in_RAX;
  undefined8 *puVar2;
  void *local_8;
  
  local_8 = in_RAX;
  iVar1 = posix_memalign(&local_8,0x40,count);
  if ((iVar1 == 0) && (local_8 != (void *)0x0)) {
    return local_8;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = PyErr_Clear;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* AlignedAllocator<alignment>::allocMemory(size_t count) {
		void *mem = rx_aligned_alloc(count, alignment);
		if (mem == nullptr)
			throw std::bad_alloc();
		return mem;
	}